

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomvec(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  uint uVar1;
  etype eVar2;
  line *plVar3;
  char *__s;
  bool bVar4;
  ulonglong uVar5;
  int iVar6;
  int iVar7;
  size_t __n;
  ulonglong uVar8;
  ulonglong uVar9;
  expr *peVar10;
  ull uVar11;
  ull uVar12;
  expr *peVar13;
  char *pcVar14;
  expr **ppeVar15;
  matches *pmVar16;
  match *pmVar17;
  int iVar18;
  long lVar19;
  expr *res_1;
  ulong uVar20;
  char *end;
  match res;
  ulong local_120;
  ulonglong local_110;
  ulonglong local_f8;
  char *local_f0;
  match local_e8;
  
  if (ctx->reverse == 0) {
    peVar10 = (expr *)calloc(0x48,1);
    peVar10->type = EXPR_VEC;
    uVar11 = getbf(*(bitfield **)((long)v + 8),a,m,ctx);
    uVar12 = getbf(*(bitfield **)((long)v + 0x10),a,m,ctx);
    if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
      local_120 = 0xffffffffffffffff;
    }
    else {
      local_120 = getbf(*(bitfield **)((long)v + 0x18),a,m,ctx);
    }
    if (uVar12 != 0) {
      uVar20 = 0;
      iVar6 = 0;
      do {
        peVar13 = (expr *)calloc(0x48,1);
        if ((local_120 >> (uVar20 & 0x3f) & 1) == 0) {
          peVar13->type = EXPR_DISCARD;
        }
        else {
          peVar13->type = EXPR_REG;
          peVar13->special = *(int *)((long)v + 0x20);
          lVar19 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pcVar14 = aprint("%s%lld",*v,lVar19 + uVar11);
          peVar13->str = pcVar14;
        }
        iVar7 = peVar10->vexprsmax;
        if (iVar7 <= peVar10->vexprsnum) {
          iVar18 = iVar7 * 2;
          if (iVar7 == 0) {
            iVar18 = 0x10;
          }
          peVar10->vexprsmax = iVar18;
          ppeVar15 = (expr **)realloc(peVar10->vexprs,(long)iVar18 << 3);
          peVar10->vexprs = ppeVar15;
        }
        iVar7 = peVar10->vexprsnum;
        peVar10->vexprsnum = iVar7 + 1;
        peVar10->vexprs[iVar7] = peVar13;
        uVar20 = uVar20 + 1;
      } while (uVar12 != uVar20);
    }
    iVar6 = ctx->atomsmax;
    if (iVar6 <= ctx->atomsnum) {
      iVar7 = 0x10;
      if (iVar6 != 0) {
        iVar7 = iVar6 * 2;
      }
      ctx->atomsmax = iVar7;
      ppeVar15 = (expr **)realloc(ctx->atoms,(long)iVar7 << 3);
      ctx->atoms = ppeVar15;
    }
    iVar6 = ctx->atomsnum;
    ctx->atomsnum = iVar6 + 1;
    ctx->atoms[iVar6] = peVar10;
  }
  else {
    plVar3 = ctx->line;
    if (plVar3->atomsnum != spos) {
      memset(&local_e8,0,0xb8);
      local_e8.lpos = spos + 1;
      peVar10 = plVar3->atoms[spos];
      if (peVar10->type != EXPR_VEC) {
        return (matches *)0x0;
      }
      uVar1 = peVar10->vexprsnum;
      if ((long)(int)uVar1 == 0) {
        local_110 = 0;
        local_120 = 0;
      }
      else {
        uVar20 = 0;
        local_f8 = 0;
        local_120 = 0;
        local_110 = 0;
        do {
          eVar2 = peVar10->vexprs[uVar20]->type;
          if (eVar2 == EXPR_DISCARD) {
LAB_0016f69c:
            bVar4 = true;
          }
          else {
            if (eVar2 == EXPR_REG) {
              pcVar14 = peVar10->vexprs[uVar20]->str;
              __s = *v;
              __n = strlen(__s);
              iVar6 = strncmp(pcVar14,__s,__n);
              if (iVar6 != 0) {
                bVar4 = false;
                goto LAB_0016f6a2;
              }
              uVar8 = strtoull(pcVar14 + __n,&local_f0,10);
              if ((*local_f0 == '\0') &&
                 ((uVar9 = uVar8, uVar5 = uVar8, local_120 == 0 ||
                  (uVar9 = local_f8, uVar5 = local_110, uVar8 == local_f8)))) {
                local_110 = uVar5;
                local_f8 = uVar9 + 1;
                local_120 = local_120 | 1L << (uVar20 & 0x3f);
                bVar4 = true;
              }
              else {
                bVar4 = false;
              }
              if (bVar4) goto LAB_0016f69c;
            }
            bVar4 = false;
          }
LAB_0016f6a2:
          if (!bVar4) {
            return (matches *)0x0;
          }
          uVar20 = uVar20 + 1;
        } while (uVar1 != uVar20);
      }
      iVar6 = setbf(&local_e8,*(bitfield **)((long)v + 8),local_110);
      if ((iVar6 != 0) &&
         (iVar6 = setbf(&local_e8,*(bitfield **)((long)v + 0x10),(long)(int)uVar1), iVar6 != 0)) {
        if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
          if ((local_120 ^ -1L << ((byte)uVar1 & 0x3f)) == 0xffffffffffffffff) goto LAB_0016f8e1;
        }
        else {
          iVar6 = setbf(&local_e8,*(bitfield **)((long)v + 0x18),local_120);
          if (iVar6 != 0) {
LAB_0016f8e1:
            pmVar16 = (matches *)calloc(0x10,1);
            iVar6 = pmVar16->mnum;
            iVar7 = pmVar16->mmax;
            if (iVar7 <= iVar6) {
              iVar18 = 0x10;
              if (iVar7 != 0) {
                iVar18 = iVar7 * 2;
              }
              pmVar16->mmax = iVar18;
              pmVar17 = (match *)realloc(pmVar16->m,(long)iVar18 * 0xb8);
              pmVar16->m = pmVar17;
            }
            pmVar16->mnum = iVar6 + 1;
            memcpy(pmVar16->m + iVar6,&local_e8,0xb8);
            return pmVar16;
          }
        }
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec APROTO {
	const struct vec *vec = v;
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_VEC);
		ull base = GETBF(vec->bf);
		ull cnt = GETBF(vec->cnt);
		ull mask = -1ull;
		if (vec->mask)
			mask = GETBF(vec->mask);
		int k = 0, i;
		for (i = 0; i < cnt; i++) {
			if (mask & 1ull<<i) {
				struct expr *sexpr = makeex(EXPR_REG);
				sexpr->special = vec->cool;
				sexpr->str = aprint("%s%lld", vec->name,  base + k++);
				ADDARRAY(expr->vexprs, sexpr);
			} else {
				struct expr *sexpr = makeex(EXPR_DISCARD);
				ADDARRAY(expr->vexprs, sexpr);
			}
		}
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		if (spos == ctx->line->atomsnum)
			return 0;
		struct match res = { 0, .lpos = spos+1 };
		const struct expr *expr = ctx->line->atoms[spos];
		if (expr->type != EXPR_VEC)
			return 0;
		ull start = 0, cnt = expr->vexprsnum, mask = 0, cur = 0;
		int i;
		for (i = 0; i < cnt; i++) {
			const struct expr *e = expr->vexprs[i];
			if (e->type == EXPR_DISCARD) {
			} else if (e->type == EXPR_REG) {
				if (strncmp(e->str, vec->name, strlen(vec->name)))
					return 0;
				char *end;
				ull num = strtoull(e->str + strlen(vec->name), &end, 10);
				if (*end)
					return 0;
				if (mask) {
					if (num != cur)
						return 0;
					cur++;
				} else {
					start = num;
					cur = num + 1;
				}
				mask |= 1ull << i;
			} else {
				return 0;
			}
		}
		if (!setbf(&res, vec->bf, start))
			return 0;
		if (!setbf(&res, vec->cnt, cnt))
			return 0;
		if (vec->mask) {
			if (!setbf(&res, vec->mask, mask))
				return 0;
		} else {
			if (mask != (1ull << cnt) - 1)
			       return 0;	
		}
		struct matches *rres = emptymatches();
		ADDARRAY(rres->m, res);
		return rres;
	}
}